

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O0

void oonf_viewer_print_help
               (autobuf *out,char *parameter,oonf_viewer_template *template,size_t count)

{
  int iVar1;
  ulong local_40;
  size_t k;
  size_t j;
  size_t i;
  size_t count_local;
  oonf_viewer_template *template_local;
  char *parameter_local;
  autobuf *out_local;
  
  if ((parameter == (char *)0x0) || (*parameter == '\0')) {
    abuf_puts(out,"Available subcommands:\n");
    for (j = 0; j < count; j = j + 1) {
      if (template[j].help_line == (char *)0x0) {
        abuf_appendf(out,"\t%s\n",template[j].json_name);
      }
      else {
        abuf_appendf(out,"\t%s: %s\n",template[j].json_name,template[j].help_line);
      }
    }
    abuf_puts(out,
              "\nUse \'json\' as the first parameter \' to generate JSON output of all keys/value pairs.\nUse \'jsonraw\' as the first parameter to generate JSON output of all keys/value pairs  without isoprefixes for numbers.\nUse \'head\' as the first parameter to generate a headline for the table.\nUse \'raw\' as the first parameter to generate a headline for the table without isoprefixes for numbers.\nYou can also add a custom template (text with keys inside) as the last parameter instead.\n"
             );
    abuf_puts(out,"Use \'help <command> <subcommand>\' to get help about a subcommand\n");
  }
  else {
    for (j = 0; j < count; j = j + 1) {
      iVar1 = strcmp(parameter,template[j].json_name);
      if (iVar1 == 0) {
        if (template[j].help != (char *)0x0) {
          abuf_puts(out,template[j].help);
        }
        abuf_appendf(out,"The subcommand \'%s\' has the following keys:\n",template[j].json_name);
        for (k = 0; k < template[j].data_size; k = k + 1) {
          for (local_40 = 0; local_40 < template[j].data[k].count; local_40 = local_40 + 1) {
            abuf_appendf(out,"\t%%%s%%\n",template[j].data[k].data[local_40].key);
          }
        }
        abuf_puts(out,
                  "\nUse \'json\' as the first parameter \' to generate JSON output of all keys/value pairs.\nUse \'jsonraw\' as the first parameter to generate JSON output of all keys/value pairs  without isoprefixes for numbers.\nUse \'head\' as the first parameter to generate a headline for the table.\nUse \'raw\' as the first parameter to generate a headline for the table without isoprefixes for numbers.\nYou can also add a custom template (text with keys inside) as the last parameter instead.\n"
                 );
        return;
      }
    }
    abuf_appendf(out,"Unknown subcommand %s\n",parameter);
  }
  return;
}

Assistant:

void
oonf_viewer_print_help(
  struct autobuf *out, const char *parameter, struct oonf_viewer_template *template, size_t count) {
  size_t i, j, k;

  if (parameter == NULL || *parameter == 0) {
    abuf_puts(out, "Available subcommands:\n");

    for (i = 0; i < count; i++) {
      if (template[i].help_line) {
        abuf_appendf(out, "\t%s: %s\n", template[i].json_name, template[i].help_line);
      }
      else {
        abuf_appendf(out, "\t%s\n", template[i].json_name);
      }
    }

    abuf_puts(out, _telnet_help);
    abuf_puts(out, "Use 'help <command> <subcommand>' to get help about a subcommand\n");
    return;
  }
  for (i = 0; i < count; i++) {
    if (strcmp(parameter, template[i].json_name) == 0) {
      if (template[i].help) {
        abuf_puts(out, template[i].help);
      }
      abuf_appendf(out, "The subcommand '%s' has the following keys:\n", template[i].json_name);

      for (j = 0; j < template[i].data_size; j++) {
        for (k = 0; k < template[i].data[j].count; k++) {
          abuf_appendf(out, "\t%%%s%%\n", template[i].data[j].data[k].key);
        }
      }

      abuf_puts(out, _telnet_help);
      return;
    }
  }

  abuf_appendf(out, "Unknown subcommand %s\n", parameter);
}